

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::ForkedPromise<void>_> * __thiscall
kj::_::NullableValue<kj::ForkedPromise<void>_>::operator=
          (NullableValue<kj::ForkedPromise<void>_> *this,
          NullableValue<kj::ForkedPromise<void>_> *other)

{
  ForkedPromise<void> *params;
  NullableValue<kj::ForkedPromise<void>_> *other_local;
  NullableValue<kj::ForkedPromise<void>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::ForkedPromise<void>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::ForkedPromise<void>>(&(other->field_1).value);
      ctor<kj::ForkedPromise<void>,kj::ForkedPromise<void>>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }